

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int libssh2_sftp_unlink_ex(LIBSSH2_SFTP *sftp,char *filename,uint filename_len)

{
  time_t start_time;
  time_t entry_time;
  int rc;
  uint filename_len_local;
  char *filename_local;
  LIBSSH2_SFTP *sftp_local;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    sftp_local._4_4_ = -0x27;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      entry_time._0_4_ = sftp_unlink(sftp,filename,(ulong)filename_len);
      if ((((int)entry_time != -0x25) || (sftp->channel->session == (LIBSSH2_SESSION *)0x0)) ||
         (sftp->channel->session->api_block_mode == 0)) break;
      entry_time._0_4_ = _libssh2_wait_socket(sftp->channel->session,start_time);
    } while ((int)entry_time == 0);
    sftp_local._4_4_ = (int)entry_time;
  }
  return sftp_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_unlink_ex(LIBSSH2_SFTP *sftp, const char *filename,
                       unsigned int filename_len)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_unlink(sftp, filename, filename_len));
    return rc;
}